

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_0::HeapTypeChildCollector::~HeapTypeChildCollector(HeapTypeChildCollector *this)

{
  _Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  *this_00;
  size_t __n;
  
  std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
            (&(this->children).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>);
  this_00 = (_Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
             *)(this->super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>
               ).super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>.
               taskList.
               super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start;
  std::
  _Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
  ::_M_deallocate(this_00,(pointer)((long)(this->
                                          super_HeapTypeChildWalker<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                                          ).
                                          super_TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>
                                          .taskList.
                                          super__Vector_base<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task,_std::allocator<wasm::(anonymous_namespace)::TypeGraphWalkerBase<wasm::(anonymous_namespace)::HeapTypeChildCollector>::Task>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)this_00 >> 4),__n);
  return;
}

Assistant:

void noteChild(HeapType type) { children.push_back(type); }